

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalSleepEx(CPalThread *pThread,DWORD dwMilliseconds,BOOL bAlertable)

{
  undefined4 local_28;
  undefined1 local_24 [4];
  ThreadWakeupReason twrWakeupReason;
  int iSignaledObjIndex;
  DWORD dwRet;
  PAL_ERROR palErr;
  BOOL bAlertable_local;
  DWORD dwMilliseconds_local;
  CPalThread *pThread_local;
  
  iSignaledObjIndex = 0;
  twrWakeupReason = ~WaitSucceeded;
  dwRet = bAlertable;
  palErr = dwMilliseconds;
  _bAlertable_local = pThread;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (bAlertable != 0) {
    iSignaledObjIndex =
         (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
    if (iSignaledObjIndex == 0) {
      return 0xc0;
    }
    if (iSignaledObjIndex == 0x490) {
      iSignaledObjIndex = 0;
    }
  }
  if (palErr == 0) {
    twrWakeupReason = WaitSucceeded;
  }
  else {
    iSignaledObjIndex =
         (**(code **)*g_pSynchronizationManager)
                   (g_pSynchronizationManager,_bAlertable_local,palErr,dwRet == 1,1,&local_28,
                    local_24);
    if (iSignaledObjIndex != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return twrWakeupReason;
      }
      abort();
    }
    switch(local_28) {
    case 0:
    case 3:
      twrWakeupReason = WaitSucceeded;
      iSignaledObjIndex = 0;
      break;
    case 1:
      if (dwRet == 0) {
        fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                ,0x287);
        fprintf(_stderr,
                "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n")
        ;
      }
      twrWakeupReason = 0xc0;
      iSignaledObjIndex =
           (**(code **)(*g_pSynchronizationManager + 0x20))
                     (g_pSynchronizationManager,_bAlertable_local);
      if (iSignaledObjIndex != 0) {
        fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                ,0x28d);
        fprintf(_stderr,
                "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
               );
      }
      break;
    case 2:
      fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x291);
      fprintf(_stderr,"Thread %p awakened with reason=MutexAbondoned from a SleepEx\n",
              _bAlertable_local);
      iSignaledObjIndex = 0x54f;
      break;
    case 4:
    default:
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      iSignaledObjIndex = 0x54f;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return twrWakeupReason;
  }
  abort();
}

Assistant:

PAL_ERROR CorUnix::InternalSleepEx (
    CPalThread * pThread,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    PAL_ERROR palErr = NO_ERROR;
    DWORD dwRet = WAIT_FAILED;
    int iSignaledObjIndex;

    TRACE("Sleeping %u ms [bAlertable=%d]", dwMilliseconds, (int)bAlertable);

    if (bAlertable)
    {
        // In this case do not use AreAPCsPending. In fact, since we are
        // not holding the synch lock(s) an APC posting may race with
        // AreAPCsPending.
        palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
        if (NO_ERROR == palErr)
        {
            dwRet = WAIT_IO_COMPLETION;
            goto InternalSleepExExit;
        }
        else if (ERROR_NOT_FOUND == palErr)
        {
            // No APC was pending, just continue
            palErr = NO_ERROR;
        }
    }

    if (dwMilliseconds > 0)
    {
        ThreadWakeupReason twrWakeupReason;

        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        true,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            goto InternalSleepExExit;
        }

        switch (twrWakeupReason)
        {
        case WaitSucceeded:
        case WaitTimeout:
            dwRet = 0;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case MutexAbondoned:
            ASSERT("Thread %p awakened with reason=MutexAbondoned from a "
                   "SleepEx\n", pThread);
            palErr = ERROR_INTERNAL_ERROR;
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            palErr = ERROR_INTERNAL_ERROR;
            break;
        }
    }
    else
    {
        dwRet = 0;
    }

    TRACE("Done sleeping %u ms [bAlertable=%d]", dwMilliseconds, (int)bAlertable);

InternalSleepExExit:
    return dwRet;
}